

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

XMLCharEncoding XMLParser::XMLNode::guessCharEncoding(void *buf,int l,char useXMLEncodingAttribute)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  XMLCharEncoding XVar5;
  byte *__s1;
  size_t __n;
  char bb [201];
  char acStack_f8 [208];
  
  XVar5 = char_encoding_error;
  if (((0x18 < l) &&
      ((guessWideCharChars == '\0' ||
       (cVar1 = myIsTextWideChar(buf,l), XVar5 = char_encoding_error, cVar1 == '\0')))) &&
     ((*buf != -0x11 ||
      ((*(char *)((long)buf + 1) != -0x45 ||
       (XVar5 = char_encoding_UTF8, *(char *)((long)buf + 2) != -0x41)))))) {
    XVar5 = char_encoding_UTF8;
    uVar4 = 0;
    do {
      switch(XML_utf8ByteTable[*(byte *)((long)buf + uVar4)]) {
      case 0:
        goto switchD_00196ea5_caseD_0;
      case 4:
        uVar4 = uVar4 + 1;
        if ((int)uVar4 < l) {
          if ((*(byte *)((long)buf + uVar4) & 0xc0) != 0x80) {
            XVar5 = char_encoding_legacy;
          }
          uVar4 = (ulong)(uint)l;
        }
      case 3:
        uVar4 = (uVar4 & 0xffffffff) + 1;
        if ((int)uVar4 < l) {
          if ((*(byte *)((long)buf + uVar4) & 0xc0) != 0x80) {
            XVar5 = char_encoding_legacy;
          }
          uVar4 = (ulong)(uint)l;
        }
      case 2:
        uVar4 = (uVar4 & 0xffffffff) + 1;
        if ((int)uVar4 < l) {
          if ((*(byte *)((long)buf + uVar4) & 0xc0) != 0x80) {
            XVar5 = char_encoding_legacy;
          }
          uVar4 = (ulong)(uint)l;
        }
      case 1:
        uVar4 = (ulong)((int)uVar4 + 1);
      }
    } while ((int)uVar4 < l);
switchD_00196ea5_caseD_0:
    if (useXMLEncodingAttribute != '\0') {
      __n = 200;
      if (l < 200) {
        __n = (size_t)(uint)l;
      }
      memcpy(acStack_f8,buf,__n);
      acStack_f8[__n] = '\0';
      pcVar3 = strstr(acStack_f8,"encoding");
      if (pcVar3 != (char *)0x0) {
        for (__s1 = (byte *)(pcVar3 + 10); uVar4 = (ulong)__s1[-2], uVar4 < 0x3e; __s1 = __s1 + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 != 0x3d) {
              return XVar5;
            }
            while( true ) {
              uVar4 = (ulong)__s1[-1];
              if (0x27 < uVar4) {
                return XVar5;
              }
              if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) break;
              __s1 = __s1 + 1;
            }
            if ((0x8400000000U >> (uVar4 & 0x3f) & 1) == 0) {
              return XVar5;
            }
            while (((ulong)*__s1 < 0x21 && ((0x100002600U >> ((ulong)*__s1 & 0x3f) & 1) != 0))) {
              __s1 = __s1 + 1;
            }
            iVar2 = strncasecmp((char *)__s1,"utf-8",5);
            if ((iVar2 == 0) || (iVar2 = strncasecmp((char *)__s1,"utf8",4), iVar2 == 0)) {
              return (uint)(XVar5 != char_encoding_legacy);
            }
            iVar2 = strncasecmp((char *)__s1,"shiftjis",8);
            if (iVar2 == 0) {
              return char_encoding_ShiftJIS;
            }
            iVar2 = strncasecmp((char *)__s1,"shift-jis",9);
            if (iVar2 == 0) {
              return char_encoding_ShiftJIS;
            }
            iVar2 = strncasecmp((char *)__s1,"sjis",4);
            if (iVar2 == 0) {
              return char_encoding_ShiftJIS;
            }
            iVar2 = strncasecmp((char *)__s1,"GB2312",6);
            if (iVar2 != 0) {
              iVar2 = strncasecmp((char *)__s1,"Big5",4);
              if (iVar2 != 0) {
                iVar2 = strncasecmp((char *)__s1,"GBK",3);
                return (uint)(iVar2 == 0) * 4 + char_encoding_legacy;
              }
              return char_encoding_Big5;
            }
            return char_encoding_GB2312;
          }
        }
      }
    }
  }
  return XVar5;
}

Assistant:

XMLNode::XMLCharEncoding
      XMLNode::guessCharEncoding(void * buf, int l, char useXMLEncodingAttribute)
    {
#ifdef _XMLWIDECHAR
        return (XMLCharEncoding)0;
#else
        if(l < 25)
            return (XMLCharEncoding)0;
        if(guessWideCharChars && (myIsTextWideChar(buf, l)))
            return (XMLCharEncoding)0;
        unsigned char * b = (unsigned char *)buf;
        if((b[0] == 0xef) && (b[1] == 0xbb) && (b[2] == 0xbf))
            return char_encoding_UTF8;

        // Match utf-8 model ?
        XMLCharEncoding bestGuess = char_encoding_UTF8;
        int i = 0;
        while(i < l)
            switch(XML_utf8ByteTable[b[i]])
            {
                case 4:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 3:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 2:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 1:
                    i++;
                    break;
                case 0:
                    i = l;
            }
        if(!useXMLEncodingAttribute)
            return bestGuess;
        // if encoding is specified and different from utf-8 than it's non-utf8
        // otherwise it's utf-8
        char bb[201];
        l = mmin(l, 200);
        memcpy(bb, buf, l);   // copy buf into bb to be able to do "bb[l]=0"
        bb[l] = 0;
        b = (unsigned char *)strstr(bb, "encoding");
        if(!b)
            return bestGuess;
        b += 8;
        while
            XML_isSPACECHAR(*b) b++;
        if(*b != '=')
            return bestGuess;
        b++;
        while
            XML_isSPACECHAR(*b) b++;
        if((*b != '\'') && (*b != '"'))
            return bestGuess;
        b++;
        while
            XML_isSPACECHAR(*b) b++;

        if((xstrnicmp((char *)b, "utf-8", 5) == 0) || (xstrnicmp((char *)b, "utf8", 4) == 0))
        {
            if(bestGuess == char_encoding_legacy)
                return char_encoding_error;
            return char_encoding_UTF8;
        }

        if((xstrnicmp((char *)b, "shiftjis", 8) == 0) || (xstrnicmp((char *)b, "shift-jis", 9) == 0)
           || (xstrnicmp((char *)b, "sjis", 4) == 0))
            return char_encoding_ShiftJIS;

        if(xstrnicmp((char *)b, "GB2312", 6) == 0)
            return char_encoding_GB2312;
        if(xstrnicmp((char *)b, "Big5", 4) == 0)
            return char_encoding_Big5;
        if(xstrnicmp((char *)b, "GBK", 3) == 0)
            return char_encoding_GBK;

        return char_encoding_legacy;
#endif
    }